

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O3

int Test_SUNLinSolSetATimes(SUNLinearSolver S,void *ATdata,ATimesFn ATimes,int myid)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = SUNLinSolSetATimes(S,ATdata,ATimes);
  if (uVar1 == 0) {
    iVar2 = 0;
    if (myid == 0) {
      puts("    PASSED test -- SUNLinSolSetATimes ");
      iVar2 = 0;
      if (print_time != 0) {
        printf("    SUNLinSolSetATimes Time: %22.15e \n \n",0);
      }
    }
  }
  else {
    printf(">>> FAILED test -- SUNLinSolSetATimes returned %d on Proc %d \n",(ulong)uVar1,
           (ulong)(uint)myid);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int Test_SUNLinSolSetATimes(SUNLinearSolver S, void *ATdata,
                            ATimesFn ATimes, int myid)
{
  int     failure;
  double  start_time, stop_time;

  /* try calling SetATimes routine: should pass/fail based on expected input */
  start_time = get_time();
  failure = SUNLinSolSetATimes(S, ATdata, ATimes);
  stop_time = get_time(); 

  if (failure) {
    printf(">>> FAILED test -- SUNLinSolSetATimes returned %d on Proc %d \n", 
           failure, myid);
    return(1);
  }
  else if (myid == 0) {
    printf("    PASSED test -- SUNLinSolSetATimes \n");
    PRINT_TIME("    SUNLinSolSetATimes Time: %22.15e \n \n", stop_time - start_time);
  }    

  return(0);
}